

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms917.cpp
# Opt level: O0

int wrightomega_ext(complex<double> z,complex<double> *w,complex<double> *e,complex<double> *r,
                   complex<double> *cond)

{
  uint uVar1;
  double dVar2;
  complex<double> *__y;
  complex<double> *this;
  complex<double> *in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  double dVar3;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 in_XMM1_Qa;
  undefined8 uVar4;
  undefined8 uVar5;
  double local_f30;
  undefined1 local_f28 [40];
  double local_f00;
  double local_ef8;
  undefined1 local_ef0 [24];
  double local_ed8;
  double local_ed0;
  undefined1 local_ec8 [16];
  double local_eb8;
  undefined1 local_eb0 [16];
  undefined1 local_ea0 [16];
  double local_e90;
  undefined1 local_e88 [16];
  undefined1 local_e78 [16];
  undefined1 local_e68 [16];
  double local_e58;
  undefined1 local_e50 [16];
  undefined1 local_e40 [16];
  double local_e30;
  undefined1 local_e28 [16];
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  undefined1 local_de8 [24];
  double local_dd0;
  double local_dc8;
  undefined1 local_dc0 [24];
  double local_da8;
  undefined1 local_da0 [16];
  undefined1 local_d90 [16];
  undefined1 local_d80 [24];
  double local_d68;
  double local_d60;
  double local_d58;
  double local_d50;
  undefined1 local_d48 [16];
  double local_d38;
  undefined1 local_d30 [16];
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  complex<double> local_cf0;
  double local_ce0;
  undefined1 local_cd8 [24];
  double local_cc0;
  double local_cb8;
  undefined1 local_cb0 [16];
  double local_ca0;
  undefined1 local_c98 [16];
  undefined1 local_c88 [16];
  double local_c78;
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  double local_c40;
  undefined1 local_c38 [16];
  undefined1 local_c28 [16];
  double local_c18;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [24];
  double local_bb8;
  double local_bb0;
  undefined1 local_ba8 [24];
  double local_b90;
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [24];
  double local_b50;
  double local_b40;
  complex<double> *local_b38 [2];
  complex<double> *local_b28 [2];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  double local_aa8;
  undefined1 local_aa0 [16];
  double local_a90;
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  double local_a48;
  undefined1 local_a40 [16];
  double local_a30;
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  double local_a08;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [24];
  double local_9c8;
  double local_9b8;
  complex<double> local_9b0;
  complex<double> local_9a0;
  complex<double> local_990;
  complex<double> local_980;
  complex<double> local_970;
  complex<double> local_960;
  complex<double> local_950;
  double local_940;
  complex<double> local_938;
  double local_928;
  complex<double> local_920;
  complex<double> local_910;
  complex<double> local_900;
  complex<double> local_8f0;
  double local_8e0;
  complex<double> local_8d8;
  double local_8c8;
  complex<double> local_8c0;
  complex<double> local_8b0;
  double local_8a0;
  complex<double> local_898;
  complex<double> local_888;
  complex<double> local_878 [2];
  complex<double> local_858 [2];
  complex<double> local_838 [2];
  complex<double> local_818;
  complex<double> local_808;
  complex<double> local_7f8;
  complex<double> local_7e8;
  complex<double> local_7d8;
  complex<double> local_7c8;
  complex<double> local_7b8;
  double local_7a8;
  complex<double> local_7a0;
  double local_790;
  complex<double> local_788;
  complex<double> local_778;
  complex<double> local_768;
  complex<double> local_758;
  double local_748;
  complex<double> local_740;
  double local_730;
  complex<double> local_728;
  complex<double> local_718;
  double local_708;
  complex<double> local_700;
  complex<double> local_6f0;
  complex<double> local_6e0 [2];
  complex<double> local_6c0 [2];
  complex<double> local_6a0 [2];
  double local_680;
  undefined1 local_678 [16];
  double local_668;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  double local_640;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  double local_618;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  double local_5e0;
  undefined1 local_5d8 [16];
  double local_5c8;
  undefined1 local_5c0 [24];
  double local_5a8;
  double local_5a0 [2];
  double local_590;
  double local_588;
  undefined1 local_580 [16];
  double local_570;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  double local_548;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  double local_520;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  double local_4f8;
  undefined1 local_4f0 [24];
  double local_4d8;
  double local_4c8;
  complex<double> local_4c0;
  double local_4b0;
  complex<double> local_4a8;
  complex<double> local_498;
  double local_488;
  complex<double> local_480;
  complex<double> local_470;
  complex<double> local_460;
  double local_450;
  complex<double> local_448;
  complex<double> local_438;
  complex<double> local_428;
  double local_418;
  complex<double> local_410;
  complex<double> local_400;
  complex<double> local_3f0;
  complex<double> local_3e0;
  complex<double> local_3d0;
  complex<double> local_3c0;
  double local_3b0 [3];
  complex<double> local_398;
  double local_388;
  undefined1 local_380 [16];
  complex<double> local_370;
  double local_360;
  complex<double> local_358;
  complex<double> local_348;
  complex<double> local_338 [2];
  complex<double> local_318;
  double local_308;
  complex<double> local_300;
  complex<double> local_2f0;
  double local_2e0;
  complex<double> local_2d8;
  complex<double> local_2c8;
  complex<double> local_2b8;
  double local_2a8;
  complex<double> local_2a0;
  complex<double> local_290;
  complex<double> local_280;
  double local_270;
  complex<double> local_268;
  complex<double> local_258;
  complex<double> local_248;
  complex<double> local_238;
  complex<double> local_228;
  double local_218 [3];
  complex<double> local_200;
  undefined1 local_1f0 [16];
  double local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [24];
  double local_1a0;
  complex<double> local_198;
  complex<double> local_188;
  complex<double> local_178;
  complex<double> local_168;
  complex<double> local_158;
  complex<double> local_148;
  complex<double> local_138;
  complex<double> local_128;
  complex<double> local_118;
  undefined8 local_100;
  complex<double> local_f8;
  undefined8 local_e0;
  complex<double> local_d8;
  complex<double> local_c8;
  complex<double> local_b8;
  double local_a8;
  double yppi;
  double ympi;
  double y;
  double x;
  complex<double> wp1;
  complex<double> t;
  double s;
  complex<double> pz;
  double pi;
  double near;
  complex<double> *cond_local;
  complex<double> *r_local;
  complex<double> *e_local;
  complex<double> *w_local;
  complex<double> z_local;
  
  __y = z._M_value._8_8_;
  this = z._M_value._0_8_;
  pz._M_value._8_8_ = 0x400921fb54442d18;
  w_local = in_XMM0_Qa;
  z_local._M_value._0_8_ = in_XMM1_Qa;
  std::complex<double>::complex((complex<double> *)&s,0.0,0.0);
  t._M_value._8_8_ = 0x3ff0000000000000;
  std::complex<double>::complex((complex<double> *)(wp1._M_value + 8),0.0,0.0);
  std::complex<double>::complex((complex<double> *)&x,0.0,0.0);
  y = std::real<double>((complex<double> *)&w_local);
  ympi = std::imag<double>((complex<double> *)&w_local);
  yppi = ympi - (double)pz._M_value._8_8_;
  local_a8 = ympi + (double)pz._M_value._8_8_;
  uVar1 = std::isnan(y);
  if (((uVar1 & 1) == 0) && (uVar1 = std::isnan(ympi), (uVar1 & 1) == 0)) {
    uVar1 = std::isinf(y);
    if (((uVar1 & 1) == 0) ||
       (((0.0 <= y || (ympi <= -(double)pz._M_value._8_8_)) || ((double)pz._M_value._8_8_ < ympi))))
    {
      uVar1 = std::isinf(y);
      if (((uVar1 & 1) == 0) && (uVar1 = std::isinf(ympi), (uVar1 & 1) == 0)) {
        if (((y != -1.0) || ((NAN(y) || (ABS(ympi) != (double)pz._M_value._8_8_)))) ||
           (NAN(ABS(ympi)) || NAN((double)pz._M_value._8_8_))) {
          if ((((y <= -2.0) || (1.0 < y)) || (ympi <= 1.0)) ||
             ((double)pz._M_value._8_8_ * 2.0 <= ympi)) {
            if (((y <= -2.0) || (1.0 < y)) ||
               ((dVar2 = (double)pz._M_value._8_8_ * -2.0, ympi <= dVar2 || (-1.0 <= ympi)))) {
              if (((-2.0 < y) || (ympi <= -(double)pz._M_value._8_8_)) ||
                 ((double)pz._M_value._8_8_ < ympi)) {
                if (((((-2.0 < y) && (y <= 1.0)) && (dVar2 = -1.0, -1.0 <= ympi)) && (ympi <= 1.0))
                   || ((dVar2 = -2.0, -2.0 < y &&
                       (dVar2 = (y - 1.0) * (y - 1.0) + ympi * ympi,
                       dVar2 <= (double)pz._M_value._8_8_ * (double)pz._M_value._8_8_)))) {
                  local_5a0[0] = 1.0;
                  std::operator-((complex<double> *)&w_local,local_5a0);
                  local_5c8 = 0.5;
                  local_5e0 = 0.5;
                  local_590 = dVar2;
                  pz._M_value._0_8_ = dVar2;
                  std::operator*(&local_5e0,(complex<double> *)&w_local);
                  local_5d8._8_8_ = dVar2;
                  std::operator+(&local_5c8,(complex<double> *)local_5d8);
                  local_618 = 0.0625;
                  local_640 = -0.005208333333333333;
                  local_668 = -0.0003255208333333333;
                  local_680 = 0.00021158854166666667;
                  local_5c0._8_8_ = dVar2;
                  std::operator*(&local_680,(complex<double> *)&s);
                  local_678._8_8_ = dVar2;
                  std::operator+(&local_668,(complex<double> *)local_678);
                  local_660._8_8_ = dVar2;
                  std::operator*((complex<double> *)local_660,(complex<double> *)&s);
                  local_650._8_8_ = dVar2;
                  std::operator+(&local_640,(complex<double> *)local_650);
                  local_638._8_8_ = dVar2;
                  std::operator*((complex<double> *)local_638,(complex<double> *)&s);
                  local_628._8_8_ = dVar2;
                  std::operator+(&local_618,(complex<double> *)local_628);
                  local_610._8_8_ = dVar2;
                  std::operator*((complex<double> *)local_610,(complex<double> *)&s);
                  local_600._8_8_ = dVar2;
                  std::operator*((complex<double> *)local_600,(complex<double> *)&s);
                  local_5f0._8_8_ = dVar2;
                  std::operator+((complex<double> *)local_5c0,(complex<double> *)local_5f0);
                  *(undefined8 *)this->_M_value = extraout_XMM0_Qa_04;
                  *(double *)(this->_M_value + 8) = dVar2;
                  local_5a8 = dVar2;
                }
                else if (((-1.05 < y) ||
                         (dVar2 = (double)pz._M_value._8_8_, ympi <= (double)pz._M_value._8_8_)) ||
                        (dVar2 = ympi - (double)pz._M_value._8_8_, (y + 1.0) * -0.75 < dVar2)) {
                  if (((-1.05 < y) ||
                      (dVar2 = (y + 1.0) * 0.75, ympi + (double)pz._M_value._8_8_ <= dVar2)) ||
                     (dVar2 = ympi + (double)pz._M_value._8_8_, 0.0 < dVar2)) {
                    std::log<double>((complex<double> *)&w_local);
                    local_a08 = 1.0;
                    local_a30 = -1.5;
                    local_a48 = 0.3333333333333333;
                    local_9b8 = dVar2;
                    pz._M_value._0_8_ = dVar2;
                    std::operator*(&local_a48,(complex<double> *)&s);
                    local_a40._8_8_ = dVar2;
                    std::operator+(&local_a30,(complex<double> *)local_a40);
                    local_a28._8_8_ = dVar2;
                    std::operator*((complex<double> *)local_a28,(complex<double> *)&s);
                    local_a18._8_8_ = dVar2;
                    std::operator+(&local_a08,(complex<double> *)local_a18);
                    local_a00._8_8_ = dVar2;
                    std::operator*((complex<double> *)local_a00,(complex<double> *)&s);
                    local_a90 = -1.0;
                    local_aa8 = 0.5;
                    local_9f0._8_8_ = dVar2;
                    std::operator*(&local_aa8,(complex<double> *)&s);
                    local_aa0._8_8_ = dVar2;
                    std::operator+(&local_a90,(complex<double> *)local_aa0);
                    local_a88._8_8_ = dVar2;
                    std::operator*((complex<double> *)local_a88,(complex<double> *)&s);
                    local_a78._8_8_ = dVar2;
                    std::operator-((complex<double> *)&s);
                    local_af8._8_8_ = dVar2;
                    std::operator+((complex<double> *)local_af8,(complex<double> *)&w_local);
                    local_ae8._8_8_ = dVar2;
                    std::operator*((complex<double> *)local_ae8,(complex<double> *)&w_local);
                    local_ad8._8_8_ = dVar2;
                    std::operator+((complex<double> *)&s,(complex<double> *)local_ad8);
                    local_ac8._8_8_ = dVar2;
                    std::operator*((complex<double> *)local_ac8,(complex<double> *)&w_local);
                    local_ab8._8_8_ = dVar2;
                    std::operator+((complex<double> *)local_a78,(complex<double> *)local_ab8);
                    local_a68._8_8_ = dVar2;
                    std::operator*((complex<double> *)local_a68,(complex<double> *)&w_local);
                    local_a58._8_8_ = dVar2;
                    std::operator+((complex<double> *)local_9f0,(complex<double> *)local_a58);
                    local_9e0._8_8_ = dVar2;
                    std::operator*((complex<double> *)&w_local,(complex<double> *)&w_local);
                    local_b18._8_8_ = dVar2;
                    std::operator*((complex<double> *)local_b18,(complex<double> *)&w_local);
                    local_b08._8_8_ = dVar2;
                    std::operator/((complex<double> *)local_9e0,(complex<double> *)local_b08);
                    *(undefined8 *)this->_M_value = extraout_XMM0_Qa_07;
                    *(double *)(this->_M_value + 8) = dVar2;
                    local_9c8 = dVar2;
                  }
                  else {
                    uVar4 = pz._M_value._8_8_;
                    std::complex<double>::complex(local_838,0.0,(double)pz._M_value._8_8_);
                    std::operator+((complex<double> *)&w_local,local_838);
                    local_838[1]._M_value._8_8_ = uVar4;
                    t._M_value._0_8_ = uVar4;
                    std::operator-((complex<double> *)(wp1._M_value + 8));
                    local_858[0]._M_value._8_8_ = uVar4;
                    std::log<double>(local_858);
                    local_8a0 = 1.0;
                    local_8c8 = -1.5;
                    local_8e0 = 0.3333333333333333;
                    local_858[1]._M_value._8_8_ = uVar4;
                    pz._M_value._0_8_ = uVar4;
                    std::operator*(&local_8e0,(complex<double> *)&s);
                    local_8d8._M_value._8_8_ = uVar4;
                    std::operator+(&local_8c8,&local_8d8);
                    local_8c0._M_value._8_8_ = uVar4;
                    std::operator*(&local_8c0,(complex<double> *)&s);
                    local_8b0._M_value._8_8_ = uVar4;
                    std::operator+(&local_8a0,&local_8b0);
                    local_898._M_value._8_8_ = uVar4;
                    std::operator*(&local_898,(complex<double> *)&s);
                    local_928 = -1.0;
                    local_940 = 0.5;
                    local_888._M_value._8_8_ = uVar4;
                    std::operator*(&local_940,(complex<double> *)&s);
                    local_938._M_value._8_8_ = uVar4;
                    std::operator+(&local_928,&local_938);
                    local_920._M_value._8_8_ = uVar4;
                    std::operator*(&local_920,(complex<double> *)&s);
                    local_910._M_value._8_8_ = uVar4;
                    std::operator-((complex<double> *)&s);
                    local_990._M_value._8_8_ = uVar4;
                    std::operator+(&local_990,(complex<double> *)(wp1._M_value + 8));
                    local_980._M_value._8_8_ = uVar4;
                    std::operator*(&local_980,(complex<double> *)(wp1._M_value + 8));
                    local_970._M_value._8_8_ = uVar4;
                    std::operator+((complex<double> *)&s,&local_970);
                    local_960._M_value._8_8_ = uVar4;
                    std::operator*(&local_960,(complex<double> *)(wp1._M_value + 8));
                    local_950._M_value._8_8_ = uVar4;
                    std::operator+(&local_910,&local_950);
                    local_900._M_value._8_8_ = uVar4;
                    std::operator*(&local_900,(complex<double> *)(wp1._M_value + 8));
                    local_8f0._M_value._8_8_ = uVar4;
                    std::operator+(&local_888,&local_8f0);
                    local_878[0]._M_value._8_8_ = uVar4;
                    std::operator*((complex<double> *)(wp1._M_value + 8),
                                   (complex<double> *)(wp1._M_value + 8));
                    local_9b0._M_value._8_8_ = uVar4;
                    std::operator*(&local_9b0,(complex<double> *)(wp1._M_value + 8));
                    local_9a0._M_value._8_8_ = uVar4;
                    std::operator/(local_878,&local_9a0);
                    *(undefined8 *)this->_M_value = extraout_XMM0_Qa_06;
                    *(undefined8 *)(this->_M_value + 8) = uVar4;
                    local_878[1]._M_value._8_8_ = uVar4;
                  }
                }
                else {
                  uVar4 = pz._M_value._8_8_;
                  std::complex<double>::complex(local_6a0,0.0,(double)pz._M_value._8_8_);
                  std::operator-((complex<double> *)&w_local,local_6a0);
                  local_6a0[1]._M_value._8_8_ = uVar4;
                  t._M_value._0_8_ = uVar4;
                  std::operator-((complex<double> *)(wp1._M_value + 8));
                  local_6c0[0]._M_value._8_8_ = uVar4;
                  std::log<double>(local_6c0);
                  local_708 = 1.0;
                  local_730 = -1.5;
                  local_748 = 0.3333333333333333;
                  local_6c0[1]._M_value._8_8_ = uVar4;
                  pz._M_value._0_8_ = uVar4;
                  std::operator*(&local_748,(complex<double> *)&s);
                  local_740._M_value._8_8_ = uVar4;
                  std::operator+(&local_730,&local_740);
                  local_728._M_value._8_8_ = uVar4;
                  std::operator*(&local_728,(complex<double> *)&s);
                  local_718._M_value._8_8_ = uVar4;
                  std::operator+(&local_708,&local_718);
                  local_700._M_value._8_8_ = uVar4;
                  std::operator*(&local_700,(complex<double> *)&s);
                  local_790 = -1.0;
                  local_7a8 = 0.5;
                  local_6f0._M_value._8_8_ = uVar4;
                  std::operator*(&local_7a8,(complex<double> *)&s);
                  local_7a0._M_value._8_8_ = uVar4;
                  std::operator+(&local_790,&local_7a0);
                  local_788._M_value._8_8_ = uVar4;
                  std::operator*(&local_788,(complex<double> *)&s);
                  local_778._M_value._8_8_ = uVar4;
                  std::operator-((complex<double> *)&s);
                  local_7f8._M_value._8_8_ = uVar4;
                  std::operator+(&local_7f8,(complex<double> *)(wp1._M_value + 8));
                  local_7e8._M_value._8_8_ = uVar4;
                  std::operator*(&local_7e8,(complex<double> *)(wp1._M_value + 8));
                  local_7d8._M_value._8_8_ = uVar4;
                  std::operator+((complex<double> *)&s,&local_7d8);
                  local_7c8._M_value._8_8_ = uVar4;
                  std::operator*(&local_7c8,(complex<double> *)(wp1._M_value + 8));
                  local_7b8._M_value._8_8_ = uVar4;
                  std::operator+(&local_778,&local_7b8);
                  local_768._M_value._8_8_ = uVar4;
                  std::operator*(&local_768,(complex<double> *)(wp1._M_value + 8));
                  local_758._M_value._8_8_ = uVar4;
                  std::operator+(&local_6f0,&local_758);
                  local_6e0[0]._M_value._8_8_ = uVar4;
                  std::operator*((complex<double> *)(wp1._M_value + 8),
                                 (complex<double> *)(wp1._M_value + 8));
                  local_818._M_value._8_8_ = uVar4;
                  std::operator*(&local_818,(complex<double> *)(wp1._M_value + 8));
                  local_808._M_value._8_8_ = uVar4;
                  std::operator/(local_6e0,&local_808);
                  *(undefined8 *)this->_M_value = extraout_XMM0_Qa_05;
                  *(undefined8 *)(this->_M_value + 8) = uVar4;
                  local_6e0[1]._M_value._8_8_ = uVar4;
                }
              }
              else {
                dVar2 = ympi;
                std::exp<double>((complex<double> *)&w_local);
                local_4f8 = 1.0;
                local_520 = -1.0;
                local_548 = 1.5;
                local_570 = -2.6666666666666665;
                local_588 = 5.208333333333333;
                local_4c8 = dVar2;
                pz._M_value._0_8_ = dVar2;
                std::operator*(&local_588,(complex<double> *)&s);
                local_580._8_8_ = dVar2;
                std::operator+(&local_570,(complex<double> *)local_580);
                local_568._8_8_ = dVar2;
                std::operator*((complex<double> *)local_568,(complex<double> *)&s);
                local_558._8_8_ = dVar2;
                std::operator+(&local_548,(complex<double> *)local_558);
                local_540._8_8_ = dVar2;
                std::operator*((complex<double> *)local_540,(complex<double> *)&s);
                local_530._8_8_ = dVar2;
                std::operator+(&local_520,(complex<double> *)local_530);
                local_518._8_8_ = dVar2;
                std::operator*((complex<double> *)local_518,(complex<double> *)&s);
                local_508._8_8_ = dVar2;
                std::operator+(&local_4f8,(complex<double> *)local_508);
                local_4f0._8_8_ = dVar2;
                std::operator*((complex<double> *)local_4f0,(complex<double> *)&s);
                *(undefined8 *)this->_M_value = extraout_XMM0_Qa_03;
                *(double *)(this->_M_value + 8) = dVar2;
                local_4d8 = dVar2;
              }
            }
            else {
              local_360 = 2.0;
              local_388 = 1.0;
              std::operator+((complex<double> *)&w_local,&local_388);
              uVar4 = pz._M_value._8_8_;
              local_380._8_8_ = dVar2;
              std::complex<double>::complex(&local_398,0.0,(double)pz._M_value._8_8_);
              std::operator+((complex<double> *)local_380,&local_398);
              local_370._M_value._8_8_ = uVar4;
              std::operator*(&local_360,&local_370);
              local_358._M_value._8_8_ = uVar4;
              std::conj<double>(&local_358);
              local_348._M_value._8_8_ = uVar4;
              std::sqrt<double>(&local_348);
              local_338[0]._M_value._8_8_ = uVar4;
              std::conj<double>(local_338);
              local_3b0[0] = -1.0;
              uVar5 = 0x3ff0000000000000;
              local_338[1]._M_value._8_8_ = uVar4;
              pz._M_value._0_8_ = uVar4;
              std::complex<double>::complex(&local_3f0,0.0,1.0);
              std::operator-(&local_3f0);
              local_418 = 0.3333333333333333;
              local_450 = 0.027777777777777776;
              uVar4 = 0x3ff0000000000000;
              local_3e0._M_value._8_8_ = uVar5;
              std::complex<double>::complex(&local_460,0.0,1.0);
              std::operator*(&local_450,&local_460);
              local_488 = 0.003703703703703704;
              local_4b0 = 0.0002314814814814815;
              uVar5 = 0x3ff0000000000000;
              local_448._M_value._8_8_ = uVar4;
              std::complex<double>::complex(&local_4c0,0.0,1.0);
              std::operator*(&local_4b0,&local_4c0);
              local_4a8._M_value._8_8_ = uVar5;
              std::operator*(&local_4a8,(complex<double> *)&s);
              local_498._M_value._8_8_ = uVar5;
              std::operator-(&local_488,&local_498);
              local_480._M_value._8_8_ = uVar5;
              std::operator*(&local_480,(complex<double> *)&s);
              local_470._M_value._8_8_ = uVar5;
              std::operator+(&local_448,&local_470);
              local_438._M_value._8_8_ = uVar5;
              std::operator*(&local_438,(complex<double> *)&s);
              local_428._M_value._8_8_ = uVar5;
              std::operator+(&local_418,&local_428);
              local_410._M_value._8_8_ = uVar5;
              std::operator*(&local_410,(complex<double> *)&s);
              local_400._M_value._8_8_ = uVar5;
              std::operator+(&local_3e0,&local_400);
              local_3d0._M_value._8_8_ = uVar5;
              std::operator*(&local_3d0,(complex<double> *)&s);
              local_3c0._M_value._8_8_ = uVar5;
              std::operator+(local_3b0,&local_3c0);
              *(undefined8 *)this->_M_value = extraout_XMM0_Qa_02;
              *(undefined8 *)(this->_M_value + 8) = uVar5;
              local_3b0[2] = (double)uVar5;
            }
          }
          else {
            local_1e0 = 2.0;
            dVar2 = -(double)pz._M_value._8_8_;
            std::complex<double>::complex(&local_200,1.0,dVar2);
            std::operator+((complex<double> *)&w_local,&local_200);
            local_1f0._8_8_ = dVar2;
            std::operator*(&local_1e0,(complex<double> *)local_1f0);
            local_1d8._8_8_ = dVar2;
            std::conj<double>((complex<double> *)local_1d8);
            local_1c8._8_8_ = dVar2;
            std::sqrt<double>((complex<double> *)local_1c8);
            local_1b8._8_8_ = dVar2;
            std::conj<double>((complex<double> *)local_1b8);
            local_218[0] = -1.0;
            local_1a0 = dVar2;
            pz._M_value._0_8_ = dVar2;
            std::complex<double>::complex(&local_248,0.0,1.0);
            local_270 = 0.3333333333333333;
            local_2a8 = -0.027777777777777776;
            uVar4 = 0x3ff0000000000000;
            std::complex<double>::complex(&local_2b8,0.0,1.0);
            std::operator*(&local_2a8,&local_2b8);
            local_2e0 = 0.003703703703703704;
            local_308 = 0.0002314814814814815;
            uVar5 = 0x3ff0000000000000;
            local_2a0._M_value._8_8_ = uVar4;
            std::complex<double>::complex(&local_318,0.0,1.0);
            std::operator*(&local_308,&local_318);
            local_300._M_value._8_8_ = uVar5;
            std::operator*(&local_300,(complex<double> *)&s);
            local_2f0._M_value._8_8_ = uVar5;
            std::operator+(&local_2e0,&local_2f0);
            local_2d8._M_value._8_8_ = uVar5;
            std::operator*(&local_2d8,(complex<double> *)&s);
            local_2c8._M_value._8_8_ = uVar5;
            std::operator+(&local_2a0,&local_2c8);
            local_290._M_value._8_8_ = uVar5;
            std::operator*(&local_290,(complex<double> *)&s);
            local_280._M_value._8_8_ = uVar5;
            std::operator+(&local_270,&local_280);
            local_268._M_value._8_8_ = uVar5;
            std::operator*(&local_268,(complex<double> *)&s);
            local_258._M_value._8_8_ = uVar5;
            std::operator+(&local_248,&local_258);
            local_238._M_value._8_8_ = uVar5;
            std::operator*(&local_238,(complex<double> *)&s);
            local_228._M_value._8_8_ = uVar5;
            std::operator+(local_218,&local_228);
            *(undefined8 *)this->_M_value = extraout_XMM0_Qa_01;
            *(undefined8 *)(this->_M_value + 8) = uVar5;
            local_218[2] = (double)uVar5;
          }
          dVar2 = y;
          if ((y <= -0.99) && ((ABS(yppi) <= 0.01 || (dVar2 = ABS(local_a8), dVar2 <= 0.01)))) {
            t._M_value._8_8_ = 0xbff0000000000000;
            if (0.01 < ABS(yppi)) {
              fesetround(0x800);
              local_a8 = ympi + (double)pz._M_value._8_8_;
              if (local_a8 <= 0.0) {
                fesetround(0x400);
                local_a8 = ympi + (double)pz._M_value._8_8_;
              }
              dVar2 = local_a8;
              std::complex<double>::complex((complex<double> *)local_b38,y,local_a8);
              w_local = local_b38[0];
              z_local._M_value._0_8_ = local_b38[1];
              fesetround(0);
            }
            else {
              fesetround(0x800);
              yppi = ympi - (double)pz._M_value._8_8_;
              if (yppi <= 0.0) {
                fesetround(0x400);
                yppi = ympi - (double)pz._M_value._8_8_;
              }
              dVar2 = yppi;
              std::complex<double>::complex((complex<double> *)local_b28,y,yppi);
              w_local = local_b28[0];
              z_local._M_value._0_8_ = local_b28[1];
              fesetround(0);
            }
          }
          std::operator*((double *)(t._M_value + 8),this);
          *(undefined8 *)this->_M_value = extraout_XMM0_Qa_08;
          *(double *)(this->_M_value + 8) = dVar2;
          local_b40 = dVar2;
          std::operator*((double *)(t._M_value + 8),this);
          local_b78._8_8_ = dVar2;
          std::operator-((complex<double> *)&w_local,(complex<double> *)local_b78);
          local_b68._8_8_ = dVar2;
          std::log<double>(this);
          local_b88._8_8_ = dVar2;
          std::operator-((complex<double> *)local_b68,(complex<double> *)local_b88);
          *(undefined8 *)w->_M_value = extraout_XMM0_Qa_09;
          *(double *)(w->_M_value + 8) = dVar2;
          local_b50 = dVar2;
          std::operator*((double *)(t._M_value + 8),this);
          local_bb0 = 1.0;
          local_ba8._8_8_ = dVar2;
          std::operator+((complex<double> *)local_ba8,&local_bb0);
          local_b90 = dVar2;
          wp1._M_value._0_8_ = dVar2;
          std::operator/(w,(complex<double> *)&x);
          local_c18 = 2.0;
          local_be0._8_8_ = dVar2;
          std::operator*(&local_c18,(complex<double> *)&x);
          local_c40 = 0.6666666666666666;
          local_c10._8_8_ = dVar2;
          std::operator*(&local_c40,w);
          local_c38._8_8_ = dVar2;
          std::operator+((complex<double> *)&x,(complex<double> *)local_c38);
          local_c28._8_8_ = dVar2;
          std::operator*((complex<double> *)local_c10,(complex<double> *)local_c28);
          local_c00._8_8_ = dVar2;
          std::operator-((complex<double> *)local_c00,w);
          local_bf0._8_8_ = dVar2;
          std::operator*((complex<double> *)local_be0,(complex<double> *)local_bf0);
          local_c78 = 2.0;
          local_bd0._8_8_ = dVar2;
          std::operator*(&local_c78,(complex<double> *)&x);
          local_ca0 = 0.6666666666666666;
          local_c70._8_8_ = dVar2;
          std::operator*(&local_ca0,w);
          local_c98._8_8_ = dVar2;
          std::operator+((complex<double> *)&x,(complex<double> *)local_c98);
          local_c88._8_8_ = dVar2;
          std::operator*((complex<double> *)local_c70,(complex<double> *)local_c88);
          local_cb8 = 2.0;
          local_c60._8_8_ = dVar2;
          std::operator*(&local_cb8,w);
          local_cb0._8_8_ = dVar2;
          std::operator-((complex<double> *)local_c60,(complex<double> *)local_cb0);
          local_c50._8_8_ = dVar2;
          std::operator/((complex<double> *)local_bd0,(complex<double> *)local_c50);
          *(undefined8 *)__y->_M_value = extraout_XMM0_Qa_10;
          *(double *)(__y->_M_value + 8) = dVar2;
          local_ce0 = 1.0;
          local_bb8 = dVar2;
          std::operator+(&local_ce0,__y);
          local_cd8._8_8_ = dVar2;
          std::operator*(this,(complex<double> *)local_cd8);
          *(undefined8 *)this->_M_value = extraout_XMM0_Qa_11;
          *(double *)(this->_M_value + 8) = dVar2;
          local_d38 = 2.0;
          local_cc0 = dVar2;
          std::operator*(&local_d38,this);
          local_d30._8_8_ = dVar2;
          std::operator*((complex<double> *)local_d30,this);
          local_d50 = 8.0;
          local_d20._8_8_ = dVar2;
          std::operator*(&local_d50,this);
          local_d48._8_8_ = dVar2;
          std::operator-((complex<double> *)local_d20,(complex<double> *)local_d48);
          local_d58 = 1.0;
          local_d10._8_8_ = dVar2;
          std::operator-((complex<double> *)local_d10,&local_d58);
          local_d00._8_8_ = dVar2;
          dVar2 = std::abs<double>(w);
          uVar4 = 0x4010000000000000;
          local_d60 = pow(dVar2,4.0);
          std::operator*((complex<double> *)local_d00,&local_d60);
          local_cf0._M_value._8_8_ = uVar4;
          dVar2 = std::abs<double>(&local_cf0);
          dVar3 = std::abs<double>((complex<double> *)&x);
          dVar3 = pow(dVar3,6.0);
          dVar3 = dVar3 * 1.5987211554602254e-14;
          if (dVar3 <= dVar2) {
            std::operator*((double *)(t._M_value + 8),this);
            local_d90._8_8_ = dVar3;
            std::operator-((complex<double> *)&w_local,(complex<double> *)local_d90);
            local_d80._8_8_ = dVar3;
            std::log<double>(this);
            local_da0._8_8_ = dVar3;
            std::operator-((complex<double> *)local_d80,(complex<double> *)local_da0);
            *(undefined8 *)w->_M_value = extraout_XMM0_Qa_12;
            *(double *)(w->_M_value + 8) = dVar3;
            local_d68 = dVar3;
            std::operator*((double *)(t._M_value + 8),this);
            local_dc8 = 1.0;
            local_dc0._8_8_ = dVar3;
            std::operator+((complex<double> *)local_dc0,&local_dc8);
            local_da8 = dVar3;
            wp1._M_value._0_8_ = dVar3;
            std::operator/(w,(complex<double> *)&x);
            local_e30 = 2.0;
            local_df8._8_8_ = dVar3;
            std::operator*(&local_e30,(complex<double> *)&x);
            local_e58 = 0.6666666666666666;
            local_e28._8_8_ = dVar3;
            std::operator*(&local_e58,w);
            local_e50._8_8_ = dVar3;
            std::operator+((complex<double> *)&x,(complex<double> *)local_e50);
            local_e40._8_8_ = dVar3;
            std::operator*((complex<double> *)local_e28,(complex<double> *)local_e40);
            local_e18._8_8_ = dVar3;
            std::operator-((complex<double> *)local_e18,w);
            local_e08._8_8_ = dVar3;
            std::operator*((complex<double> *)local_df8,(complex<double> *)local_e08);
            local_e90 = 2.0;
            local_de8._8_8_ = dVar3;
            std::operator*(&local_e90,(complex<double> *)&x);
            local_eb8 = 0.6666666666666666;
            local_e88._8_8_ = dVar3;
            std::operator*(&local_eb8,w);
            local_eb0._8_8_ = dVar3;
            std::operator+((complex<double> *)&x,(complex<double> *)local_eb0);
            local_ea0._8_8_ = dVar3;
            std::operator*((complex<double> *)local_e88,(complex<double> *)local_ea0);
            local_ed0 = 2.0;
            local_e78._8_8_ = dVar3;
            std::operator*(&local_ed0,w);
            local_ec8._8_8_ = dVar3;
            std::operator-((complex<double> *)local_e78,(complex<double> *)local_ec8);
            local_e68._8_8_ = dVar3;
            std::operator/((complex<double> *)local_de8,(complex<double> *)local_e68);
            *(undefined8 *)__y->_M_value = extraout_XMM0_Qa_13;
            *(double *)(__y->_M_value + 8) = dVar3;
            local_ef8 = 1.0;
            local_dd0 = dVar3;
            std::operator+(&local_ef8,__y);
            local_ef0._8_8_ = dVar3;
            std::operator*(this,(complex<double> *)local_ef0);
            *(undefined8 *)this->_M_value = extraout_XMM0_Qa_14;
            *(double *)(this->_M_value + 8) = dVar3;
            local_ed8 = dVar3;
          }
          std::operator*((double *)(t._M_value + 8),this);
          *(undefined8 *)this->_M_value = extraout_XMM0_Qa_15;
          *(double *)(this->_M_value + 8) = dVar3;
          local_f30 = 1.0;
          local_f00 = dVar3;
          std::operator+(&local_f30,this);
          local_f28._8_8_ = dVar3;
          std::operator/((complex<double> *)&w_local,(complex<double> *)local_f28);
          *(undefined8 *)e->_M_value = extraout_XMM0_Qa_16;
          *(double *)(e->_M_value + 8) = dVar3;
        }
        else {
          std::complex<double>::complex(&local_178,-1.0,0.0);
          *(undefined8 *)this->_M_value = local_178._M_value._0_8_;
          *(undefined8 *)(this->_M_value + 8) = local_178._M_value._8_8_;
          std::complex<double>::complex(&local_188,0.0,0.0);
          *(undefined8 *)__y->_M_value = local_188._M_value._0_8_;
          *(undefined8 *)(__y->_M_value + 8) = local_188._M_value._8_8_;
          std::complex<double>::complex(&local_198,0.0,0.0);
          *(undefined8 *)w->_M_value = local_198._M_value._0_8_;
          *(undefined8 *)(w->_M_value + 8) = local_198._M_value._8_8_;
        }
      }
      else {
        std::complex<double>::complex(&local_148,y,ympi);
        *(undefined8 *)this->_M_value = local_148._M_value._0_8_;
        *(undefined8 *)(this->_M_value + 8) = local_148._M_value._8_8_;
        std::complex<double>::complex(&local_158,0.0,0.0);
        *(undefined8 *)__y->_M_value = local_158._M_value._0_8_;
        *(undefined8 *)(__y->_M_value + 8) = local_158._M_value._8_8_;
        std::complex<double>::complex(&local_168,0.0,0.0);
        *(undefined8 *)w->_M_value = local_168._M_value._0_8_;
        *(undefined8 *)(w->_M_value + 8) = local_168._M_value._8_8_;
      }
    }
    else {
      if ((double)pz._M_value._8_8_ / 2.0 < ABS(ympi)) {
        std::complex<double>::operator=(this,-0.0);
      }
      else {
        std::complex<double>::operator=(this,0.0);
      }
      if (ympi < 0.0) {
        uVar4 = 0x8000000000000000;
        std::complex<double>::complex(&local_118,0.0,-0.0);
        std::operator+(this,&local_118);
        *(undefined8 *)this->_M_value = extraout_XMM0_Qa_00;
        *(undefined8 *)(this->_M_value + 8) = uVar4;
        local_100 = uVar4;
      }
      else {
        uVar4 = 0;
        std::complex<double>::complex(&local_f8,0.0,0.0);
        std::operator+(this,&local_f8);
        *(undefined8 *)this->_M_value = extraout_XMM0_Qa;
        *(undefined8 *)(this->_M_value + 8) = uVar4;
        local_e0 = uVar4;
      }
      std::complex<double>::complex(&local_128,0.0,0.0);
      *(undefined8 *)__y->_M_value = local_128._M_value._0_8_;
      *(undefined8 *)(__y->_M_value + 8) = local_128._M_value._8_8_;
      std::complex<double>::complex(&local_138,0.0,0.0);
      *(undefined8 *)w->_M_value = local_138._M_value._0_8_;
      *(undefined8 *)(w->_M_value + 8) = local_138._M_value._8_8_;
    }
  }
  else {
    std::complex<double>::complex(&local_b8,NAN,NAN);
    *(undefined8 *)this->_M_value = local_b8._M_value._0_8_;
    *(undefined8 *)(this->_M_value + 8) = local_b8._M_value._8_8_;
    std::complex<double>::complex(&local_c8,0.0,0.0);
    *(undefined8 *)__y->_M_value = local_c8._M_value._0_8_;
    *(undefined8 *)(__y->_M_value + 8) = local_c8._M_value._8_8_;
    std::complex<double>::complex(&local_d8,0.0,0.0);
    *(undefined8 *)w->_M_value = local_d8._M_value._0_8_;
    *(undefined8 *)(w->_M_value + 8) = local_d8._M_value._8_8_;
  }
  return 0;
}

Assistant:

int wrightomega_ext ( std::complex <double> z, std::complex <double> &w, 
  std::complex <double> &e, std::complex <double> &r, std::complex <double> &cond )

//****************************************************************************80
//
//  Purpose:
//
//    WRIGHTOMEGA_EXT computes the Wright Omega function with extra information.
//
//  Discussion:
//
//    WRIGHTOMEGA_EXT is the extended routine for evaluating the Wright
//    Omega function with the option of extracting the last update step,
//    the penultimate residual and the condition number estimate.
//
//  Modified:
//
//    14 May 2016
//
//  Author:
//
//    Piers Lawrence, Robert Corless, David Jeffrey
//
//  Reference:
//
//    Piers Lawrence, Robert Corless, David Jeffrey,
//    Algorithm 917: Complex Double-Precision Evaluation of the Wright Omega 
//    Function,
//    ACM Transactions on Mathematical Software,
//    Volume 38, Number 3, Article 20, April 2012, 17 pages.
//
//  Parameters:
//
//    Input, complex <double> Z, value at which to evaluate Wrightomega().
//
//    Output, complex <double> &W, the value of Wrightomega(z).
//
//    Output, complex <double> &E, the last update step in the iterative scheme.
//
//    Output, complex <double> &R, the penultimate residual,
//    r_k = z - w_k - log(w_k)
//
//    Output, complex <double> &COND, the condition number estimate. 
//
//    Output, int WRIGHTOMEGA_EXT, error flag;
//    0, successful computation.
//    nonzero, the computation failed.        
//
{
  double near;
  double pi = 3.1415926535897932384626433832795029;//M_PI;
  std::complex <double> pz;
  double s = 1.0;
  std::complex <double> t;
  std::complex <double> wp1;
  double x;
  double y;
  double ympi;
  double yppi;
// 
//  Extract real and imaginary parts of Z. 
//
  x = std::real ( z );
  y = std::imag ( z );
// 
//  Compute if we are near the branch cuts.
//
  ympi = y - pi;
  yppi = y + pi;
  near = 0.01;
// 
//  Test for floating point exceptions:
//

//
//  NaN output for NaN input.
//
  if ( std::isnan ( x ) || std::isnan ( y ) )
  {
    w = std::complex <double> ( ( 0.0 / 0.0 ), ( 0.0 / 0.0 ) );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Signed zeros between branches.
//
  else if ( std::isinf ( x ) && ( x < 0.0 ) && ( - pi < y ) && ( y <= pi ) )
  {
    if ( fabs ( y ) <= pi / 2.0 )
    {
      w = + 0.0;
    }
    else
    {
      w = - 0.0;
    }
      
    if ( 0.0 <= y )
    {
      w = w + std::complex <double> ( 0.0, 0.0 );
    }
    else
    {
      w = w + std::complex <double> ( 0.0, - 1.0 * 0.0 );
    }

    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Asymptotic for large z.
//
  else if ( std::isinf ( x ) || std::isinf ( y ) )
  {
    w = std::complex <double> ( x, y );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Test if exactly on the singular points.
//
  if ( ( x == - 1.0 ) && ( fabs ( y ) == pi ) )
  {
    w = std::complex <double> ( - 1.0, 0.0 );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
// 
//  Choose approximation based on region.
//

//
//  Region 1: upper branch point.
//  Series about z=-1+Pi*I.
//
  if ( ( - 2.0 < x && x <= 1.0 && 1.0 < y && y < 2.0 * pi ) )
  {
    pz = conj ( sqrt ( conj ( 2.0 * ( z + std::complex <double> ( 1.0, - pi ) ) ) ) );

    w = - 1.0 
      + ( std::complex <double> ( 0.0, 1.0 )
      + ( 1.0 / 3.0 
      + ( - 1.0 / 36.0 * std::complex <double> ( 0.0, 1.0 ) 
      + ( 1.0 / 270.0 + 1.0 / 4320.0 * std::complex <double> ( 0.0, 1.0 ) * pz ) 
      * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 2: lower branch point.
//  Series about z=-1-Pi*I.
//
  else if ( ( - 2.0 < x && x <= 1.0 && - 2.0 * pi < y && y <- 1.0 ) )
  {
    pz = conj ( sqrt ( conj ( 2.0 * ( z + 1.0 + std::complex <double> ( 0.0, pi ) ) ) ) );

    w = - 1.0 
      + ( - std::complex <double> ( 0.0, 1.0 ) + ( 1.0 / 3.0 
      + ( 1.0 / 36.0 * std::complex <double> ( 0.0, 1.0 )
      + ( 1.0 / 270.0 - 1.0 / 4320.0 * std::complex <double> ( 0.0, 1.0 ) * pz ) 
      * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 3: between branch cuts.
//  Series: About -infinity.
//
  else if ( x <= - 2.0 && - pi < y && y <= pi )
  {
    pz = exp ( z );
    w = ( 1.0 
      + ( - 1.0 
      + ( 3.0 / 2.0 
      + ( - 8.0 / 3.0 
      + 125.0 / 24.0 * pz ) * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 4: Mushroom.
//  Series about z=1.
//
  else if ( ( ( - 2.0 < x ) && ( x <= 1.0 ) && ( - 1.0 <= y ) && ( y <= 1.0 ) )
    || ( ( - 2.0 < x ) && ( x - 1.0 ) * ( x - 1.0 ) + y * y <= pi * pi ) )
  {
    pz = z - 1.0;
    w = 1.0 / 2.0 + 1.0 / 2.0 * z 
      + ( 1.0 / 16.0 
      + ( - 1.0 / 192.0 
      + ( - 1.0 / 3072.0 + 13.0 / 61440.0 * pz ) * pz ) * pz ) * pz * pz;
  }
//
//  Region 5: Top wing.
//  Negative log series.
//
  else if ( x <= - 1.05 && pi < y && y - pi <= - 0.75 * ( x + 1.0 ) )
  {
    t = z - std::complex <double> ( 0.0, pi );
    pz = log ( - t );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz 
      + ( ( -1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + t ) * t ) * t ) * t ) 
      / ( t * t * t );
  }
//
//  Region 6: Bottom wing.
//  Negative log series.
//
  else if ( x <= - 1.05 && 0.75 * ( x + 1.0 ) < y + pi && y + pi <= 0.0 )
  {
    t = z + std::complex <double> ( 0.0, pi );
    pz = log ( - t );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz
      + ( ( - 1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + t ) * t ) * t ) * t ) 
      / ( t * t * t );
  }
//
//  Region 7: Everywhere else.
//  Series solution about infinity.
//
  else
  {
    pz = log ( z );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz 
      + ( ( - 1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + z ) * z ) * z ) * z ) 
      / ( z * z * z );
  }
//
//  Regularize if near branch cuts.
///
  if ( x <= - 1.0 + near && ( fabs ( ympi ) <= near || fabs ( yppi ) <= near ) ) 
  { 
    s = - 1.0;
    if ( fabs ( ympi ) <= near )
    {
//
//  Recompute ympi with directed rounding.
//
      fesetround ( FE_UPWARD );
      ympi = y - pi;
          
      if ( ympi <= 0.0 )
      {
        fesetround ( FE_DOWNWARD );
        ympi = y - pi;
      }
         
      z = std::complex <double> ( x, ympi ); 
// 
//  Return rounding to default.
//
      fesetround ( FE_TONEAREST );
    }
    else
    {
//
//  Recompute yppi with directed rounding.
//
      fesetround ( FE_UPWARD );
      yppi = y + pi;
          
      if ( yppi <= 0.0 )
      {
        fesetround ( FE_DOWNWARD );
        yppi = y + pi;
      }

      z = std::complex <double> ( x, yppi );
// 
//  Return rounding to default.
//
      fesetround ( FE_TONEAREST );
    }
  }
//
//  Iteration one.
//
  w = s * w;
  r = z - s * w - log ( w );
  wp1 = s * w + 1.0;
  e = r / wp1 * ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - r )
    / ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - 2.0 * r );
  w = w * ( 1.0 + e );
//
//  Iteration two.
//
  if ( abs ( ( 2.0 * w * w - 8.0 * w - 1.0 ) * pow ( abs ( r ), 4.0 ) ) 
    >= TWOITERTOL * 72.0 * pow ( abs ( wp1 ), 6.0 ) )
  {
    r = z - s * w - log ( w );
    wp1 = s * w + 1.0;
    e = r / wp1 * ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - r ) 
      / ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - 2.0 * r );
    w = w * ( 1.0 + e );
  }
//
//  Undo regularization.
//
  w = s * w;
//
//  Provide condition number estimate.
//
  cond = z / ( 1.0 + w );
      
  return 0;
}